

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

quicly_cid_encryptor_t *
quicly_new_default_cid_encryptor
          (ptls_cipher_algorithm_t *cid_cipher,ptls_cipher_algorithm_t *reset_token_cipher,
          ptls_hash_algorithm_t *hash,ptls_iovec_t key)

{
  ptls_iovec_t secret;
  ptls_iovec_t hash_value;
  ptls_iovec_t hash_value_00;
  int iVar1;
  ptls_cipher_context_t *ppVar2;
  uint8_t *in_RCX;
  ptls_hash_algorithm_t *in_RDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  ptls_iovec_t pVar3;
  uint8_t keybuf [32];
  uint8_t digestbuf [64];
  st_quicly_default_encrypt_cid_t *self;
  size_t in_stack_fffffffffffffec0;
  void *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  ptls_hash_algorithm_t *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  ptls_cipher_algorithm_t *outlen;
  void *in_stack_fffffffffffffee8;
  void *output;
  ptls_hash_algorithm_t *algo;
  ptls_cipher_algorithm_t *algo_00;
  size_t sVar4;
  uint8_t *in_stack_ffffffffffffff10;
  uint8_t *puVar5;
  char *label_prefix;
  code *local_d8;
  code *local_d0;
  code *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  ptls_iovec_t local_a8;
  ptls_cipher_algorithm_t local_98 [2];
  quicly_cid_encryptor_t *local_38;
  ptls_hash_algorithm_t *local_30;
  long local_28;
  long local_20;
  uint8_t *local_18;
  ulong local_10;
  
  if ((*(long *)(in_RDI + 0x10) != 8) && (*(long *)(in_RDI + 0x10) != 0x10)) {
    __assert_fail("cid_cipher->block_size == 8 || cid_cipher->block_size == 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                  ,0xc0,
                  "quicly_cid_encryptor_t *quicly_new_default_cid_encryptor(ptls_cipher_algorithm_t *, ptls_cipher_algorithm_t *, ptls_hash_algorithm_t *, ptls_iovec_t)"
                 );
  }
  if (*(long *)(in_RSI + 0x10) != 0x10) {
    __assert_fail("reset_token_cipher->block_size == 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                  ,0xc1,
                  "quicly_cid_encryptor_t *quicly_new_default_cid_encryptor(ptls_cipher_algorithm_t *, ptls_cipher_algorithm_t *, ptls_hash_algorithm_t *, ptls_iovec_t)"
                 );
  }
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_18 = in_RCX;
  local_10 = in_R8;
  if (in_RDX->block_size < in_R8) {
    ptls_calc_hash(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffec0);
    local_a8 = ptls_iovec_init(&local_98[0].context_size,local_30->digest_size);
    local_18 = local_a8.base;
    local_10 = local_a8.len;
  }
  local_38 = (quicly_cid_encryptor_t *)malloc(0x30);
  if (local_38 != (quicly_cid_encryptor_t *)0x0) {
    local_d8 = default_encrypt_cid;
    local_d0 = default_decrypt_cid;
    local_c8 = default_generate_reset_token;
    local_c0 = 0;
    local_b8 = 0;
    local_b0 = 0;
    memcpy(local_38,&local_d8,0x30);
    algo_00 = local_98;
    sVar4 = *(size_t *)(local_20 + 8);
    algo = local_30;
    pVar3 = ptls_iovec_init((void *)0x0,0);
    puVar5 = pVar3.base;
    label_prefix = (char *)pVar3.len;
    pVar3.len = sVar4;
    pVar3.base = (uint8_t *)algo_00;
    hash_value.len = (size_t)puVar5;
    hash_value.base = in_stack_ffffffffffffff10;
    iVar1 = ptls_hkdf_expand_label
                      (algo,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,pVar3,
                       (char *)in_stack_fffffffffffffed8,hash_value,label_prefix);
    if (iVar1 == 0) {
      ppVar2 = ptls_cipher_new(algo_00,(int)((ulong)algo >> 0x20),in_stack_fffffffffffffee8);
      local_38[1].encrypt_cid =
           (_func_void_st_quicly_cid_encryptor_t_ptr_quicly_cid_t_ptr_void_ptr_quicly_cid_plaintext_t_ptr
            *)ppVar2;
      if (ppVar2 != (ptls_cipher_context_t *)0x0) {
        ppVar2 = ptls_cipher_new(algo_00,(int)((ulong)algo >> 0x20),in_stack_fffffffffffffee8);
        local_38[1].decrypt_cid =
             (_func_size_t_st_quicly_cid_encryptor_t_ptr_quicly_cid_plaintext_t_ptr_void_ptr_size_t
              *)ppVar2;
        if (ppVar2 != (ptls_cipher_context_t *)0x0) {
          outlen = local_98;
          output = *(void **)(local_28 + 8);
          pVar3 = ptls_iovec_init((void *)0x0,0);
          secret.len = sVar4;
          secret.base = (uint8_t *)algo_00;
          hash_value_00.len = (size_t)puVar5;
          hash_value_00.base = (uint8_t *)pVar3.len;
          iVar1 = ptls_hkdf_expand_label
                            (algo,output,(size_t)outlen,secret,(char *)local_30,hash_value_00,
                             label_prefix);
          if (iVar1 == 0) {
            ppVar2 = ptls_cipher_new(algo_00,(int)((ulong)algo >> 0x20),output);
            local_38[1].generate_stateless_reset_token =
                 (_func_int_st_quicly_cid_encryptor_t_ptr_void_ptr_void_ptr *)ppVar2;
            if (ppVar2 != (ptls_cipher_context_t *)0x0) {
              (*ptls_clear_memory)(&local_98[0].context_size,0x40);
              (*ptls_clear_memory)(local_98,0x20);
              return local_38;
            }
          }
        }
      }
    }
  }
  if (local_38 != (quicly_cid_encryptor_t *)0x0) {
    if (local_38[1].encrypt_cid !=
        (_func_void_st_quicly_cid_encryptor_t_ptr_quicly_cid_t_ptr_void_ptr_quicly_cid_plaintext_t_ptr
         *)0x0) {
      ptls_cipher_free((ptls_cipher_context_t *)0x12d096);
    }
    if (local_38[1].decrypt_cid !=
        (_func_size_t_st_quicly_cid_encryptor_t_ptr_quicly_cid_plaintext_t_ptr_void_ptr_size_t *)0x0
       ) {
      ptls_cipher_free((ptls_cipher_context_t *)0x12d0b6);
    }
    if (local_38[1].generate_stateless_reset_token !=
        (_func_int_st_quicly_cid_encryptor_t_ptr_void_ptr_void_ptr *)0x0) {
      ptls_cipher_free((ptls_cipher_context_t *)0x12d0d6);
    }
    free(local_38);
  }
  (*ptls_clear_memory)(&local_98[0].context_size,0x40);
  (*ptls_clear_memory)(local_98,0x20);
  return (quicly_cid_encryptor_t *)0x0;
}

Assistant:

quicly_cid_encryptor_t *quicly_new_default_cid_encryptor(ptls_cipher_algorithm_t *cid_cipher,
                                                         ptls_cipher_algorithm_t *reset_token_cipher, ptls_hash_algorithm_t *hash,
                                                         ptls_iovec_t key)
{
    struct st_quicly_default_encrypt_cid_t *self;
    uint8_t digestbuf[PTLS_MAX_DIGEST_SIZE], keybuf[PTLS_MAX_SECRET_SIZE];

    assert(cid_cipher->block_size == 8 || cid_cipher->block_size == 16);
    assert(reset_token_cipher->block_size == 16);

    if (key.len > hash->block_size) {
        ptls_calc_hash(hash, digestbuf, key.base, key.len);
        key = ptls_iovec_init(digestbuf, hash->digest_size);
    }

    if ((self = malloc(sizeof(*self))) == NULL)
        goto Fail;
    *self = (struct st_quicly_default_encrypt_cid_t){{default_encrypt_cid, default_decrypt_cid, default_generate_reset_token}};

    if (ptls_hkdf_expand_label(hash, keybuf, cid_cipher->key_size, key, "cid", ptls_iovec_init(NULL, 0), "") != 0)
        goto Fail;
    if ((self->cid_encrypt_ctx = ptls_cipher_new(cid_cipher, 1, keybuf)) == NULL)
        goto Fail;
    if ((self->cid_decrypt_ctx = ptls_cipher_new(cid_cipher, 0, keybuf)) == NULL)
        goto Fail;
    if (ptls_hkdf_expand_label(hash, keybuf, reset_token_cipher->key_size, key, "reset", ptls_iovec_init(NULL, 0), "") != 0)
        goto Fail;
    if ((self->reset_token_ctx = ptls_cipher_new(reset_token_cipher, 1, keybuf)) == NULL)
        goto Fail;

    ptls_clear_memory(digestbuf, sizeof(digestbuf));
    ptls_clear_memory(keybuf, sizeof(keybuf));
    return &self->super;

Fail:
    if (self != NULL) {
        if (self->cid_encrypt_ctx != NULL)
            ptls_cipher_free(self->cid_encrypt_ctx);
        if (self->cid_decrypt_ctx != NULL)
            ptls_cipher_free(self->cid_decrypt_ctx);
        if (self->reset_token_ctx != NULL)
            ptls_cipher_free(self->reset_token_ctx);
        free(self);
    }
    ptls_clear_memory(digestbuf, sizeof(digestbuf));
    ptls_clear_memory(keybuf, sizeof(keybuf));
    return NULL;
}